

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySubImage3D.hpp
# Opt level: O1

void __thiscall
glcts::TextureCubeMapArraySubImage3D::~TextureCubeMapArraySubImage3D
          (TextureCubeMapArraySubImage3D *this)

{
  ~TextureCubeMapArraySubImage3D(this);
  operator_delete(this,0x2f0);
  return;
}

Assistant:

virtual ~TextureCubeMapArraySubImage3D()
	{
	}